

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O3

void EpdSubtract2(EpDouble *epd1,EpDouble *epd2)

{
  int iVar1;
  int iVar2;
  int __exponent;
  EpType val;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = (epd1->type).value;
  if (((uint)((ulong)dVar4 >> 0x34) < 0xfff || ((ulong)dVar4 & 0xfffffffffffff) != 0x8000000000000)
     && (dVar5 = (epd2->type).value,
        ((ulong)dVar5 & 0xfffffffffffff) != 0x8000000000000 || (ulong)dVar5 < 0xfff0000000000000)) {
    if (ABS(dVar4) == INFINITY) {
      if (ABS(dVar5) == INFINITY) {
        if ((long)((ulong)dVar5 ^ (ulong)dVar4) < 0) {
          return;
        }
        goto LAB_00816228;
      }
    }
    else if (ABS(dVar5) != INFINITY) {
      if (((ulong)dVar4 & 0x7ff0000000000000) != 0x3ff0000000000000) {
        __assert_fail("epd1->type.bits.exponent == EPD_MAX_BIN",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/epd/epd.c"
                      ,0x329,"void EpdSubtract2(EpDouble *, EpDouble *)");
      }
      if (((ulong)dVar5 & 0x7ff0000000000000) != 0x3ff0000000000000) {
        __assert_fail("epd2->type.bits.exponent == EPD_MAX_BIN",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/epd/epd.c"
                      ,0x32a,"void EpdSubtract2(EpDouble *, EpDouble *)");
      }
      iVar2 = epd1->exponent;
      iVar1 = epd2->exponent;
      __exponent = iVar2 - iVar1;
      if (__exponent == 0 || iVar2 < iVar1) {
        if (iVar2 < iVar1) {
          if (iVar1 - iVar2 < 0x400) {
            dVar5 = ldexp(1.0,iVar1 - iVar2);
            dVar4 = dVar4 / dVar5 - (epd2->type).value;
            iVar2 = epd2->exponent;
          }
          else {
            dVar4 = -dVar5;
            iVar2 = iVar1;
          }
        }
        else {
          dVar4 = dVar4 - dVar5;
        }
      }
      else if (__exponent < 0x400) {
        dVar3 = ldexp(1.0,__exponent);
        dVar4 = dVar4 - dVar5 / dVar3;
        iVar2 = epd1->exponent;
      }
      (epd1->type).value = dVar4;
      epd1->exponent = iVar2;
      EpdNormalize(epd1);
      return;
    }
    if (ABS(dVar5) == INFINITY) {
      (epd1->type).value = dVar5;
      epd1->exponent = epd2->exponent;
    }
  }
  else {
LAB_00816228:
    (epd1->type).value = -NAN;
    epd1->exponent = 0;
  }
  return;
}

Assistant:

void
EpdSubtract2(EpDouble *epd1, EpDouble *epd2)
{
  double        value;
  int           exponent, diff;

  if (EpdIsNan(epd1) || EpdIsNan(epd2)) {
    EpdMakeNan(epd1);
    return;
  } else if (EpdIsInf(epd1) || EpdIsInf(epd2)) {
    int sign;

    if (EpdIsInf(epd1) && EpdIsInf(epd2)) {
      sign = epd1->type.bits.sign ^ epd2->type.bits.sign;
      if (sign == 0)
        EpdMakeNan(epd1);
    } else if (EpdIsInf(epd2)) {
      EpdCopy(epd2, epd1);
    }
    return;
  }

  assert(epd1->type.bits.exponent == EPD_MAX_BIN);
  assert(epd2->type.bits.exponent == EPD_MAX_BIN);

  if (epd1->exponent > epd2->exponent) {
    diff = epd1->exponent - epd2->exponent;
    if (diff <= EPD_MAX_BIN) {
      value = epd1->type.value -
                epd2->type.value / pow((double)2.0, (double)diff);
    } else
      value = epd1->type.value;
    exponent = epd1->exponent;
  } else if (epd1->exponent < epd2->exponent) {
    diff = epd2->exponent - epd1->exponent;
    if (diff <= EPD_MAX_BIN) {
      value = epd1->type.value / pow((double)2.0, (double)diff) -
                epd2->type.value;
    } else
      value = epd2->type.value * (double)(-1.0);
    exponent = epd2->exponent;
  } else {
    value = epd1->type.value - epd2->type.value;
    exponent = epd1->exponent;
  }
  epd1->type.value = value;
  epd1->exponent = exponent;
  EpdNormalize(epd1);
}